

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O1

void web_server_accept(SOCKET lsock,fd_set *set)

{
  uint __fd;
  int iVar1;
  uint *arg;
  int *piVar2;
  long lVar3;
  sockaddr *psVar4;
  uint *puVar5;
  byte bVar6;
  socklen_t clientLen;
  char errorBuffer [256];
  sockaddr_storage clientAddr;
  socklen_t local_19c;
  ThreadPoolJob local_198 [5];
  sockaddr local_98 [8];
  
  bVar6 = 0;
  if (lsock != -1) {
    iVar1 = lsock + 0x3f;
    if (-1 < lsock) {
      iVar1 = lsock;
    }
    if (((ulong)set->__fds_bits[iVar1 >> 6] >> ((ulong)(uint)lsock & 0x3f) & 1) != 0) {
      local_19c = 0x80;
      __fd = accept(lsock,local_98,&local_19c);
      if (__fd == 0xffffffff) {
        piVar2 = __errno_location();
        __xpg_strerror_r(*piVar2,local_198,0x100);
        UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x211,
                   "miniserver: Error in accept(): %s\n",local_198);
      }
      else {
        local_198[0].requestTime.tv_usec = 0;
        local_198[0].priority = LOW_PRIORITY;
        local_198[0].jobId = 0;
        local_198[0].free_func = (free_routine)0x0;
        local_198[0].requestTime.tv_sec = 0;
        local_198[0].func = (start_routine)0x0;
        local_198[0].arg = (void *)0x0;
        arg = (uint *)malloc(0x88);
        if (arg == (uint *)0x0) {
          UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1dd,
                     "mserv %d: out of memory\n",(ulong)__fd);
        }
        else {
          *arg = __fd;
          psVar4 = local_98;
          puVar5 = arg + 2;
          for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
            *(undefined8 *)puVar5 = *(undefined8 *)psVar4;
            psVar4 = (sockaddr *)(psVar4[-(ulong)bVar6].sa_data + 6);
            puVar5 = puVar5 + (ulong)bVar6 * -4 + 2;
          }
          TPJobInit(local_198,handle_request,arg);
          TPJobSetFreeFunction(local_198,free_handle_request_arg);
          TPJobSetPriority(local_198,MED_PRIORITY);
          iVar1 = ThreadPoolAdd(&gMiniServerThreadPool,local_198,(int *)0x0);
          if (iVar1 == 0) {
            return;
          }
          UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1ef,
                     "mserv %d: cannot schedule request\n",(ulong)__fd);
          free(arg);
        }
        close(__fd);
      }
    }
  }
  return;
}

Assistant:

static void web_server_accept(SOCKET lsock, fd_set *set)
{
	#ifdef INTERNAL_WEB_SERVER
	SOCKET asock;
	socklen_t clientLen;
	struct sockaddr_storage clientAddr;
	char errorBuffer[ERROR_BUFFER_LEN];

	if (lsock != INVALID_SOCKET && FD_ISSET(lsock, set)) {
		clientLen = sizeof(clientAddr);
		asock = accept(
			lsock, (struct sockaddr *)&clientAddr, &clientLen);
		if (asock == INVALID_SOCKET) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"miniserver: Error in accept(): %s\n",
				errorBuffer);
		} else {
			schedule_request_job(
				asock, (struct sockaddr *)&clientAddr);
		}
	}
	#endif /* INTERNAL_WEB_SERVER */
}